

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O2

void crotg(complex<float> *ca,complex<float> cb,float *c,complex<float> *s)

{
  complex<float> z;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float in_XMM0_Db;
  float extraout_XMM0_Db;
  float local_78;
  float fStack_74;
  complex<float> local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  double local_50;
  float fStack_48;
  float fStack_44;
  complex<float> cb_local;
  
  z._M_value = (_ComplexT_conflict)ca;
  fStack_48 = in_XMM0_Da;
  fStack_44 = in_XMM0_Db;
  fVar1 = cabs2((complex<float>)ca);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = cabs2(z);
    local_68 = fStack_44;
    fStack_64 = fStack_44;
    fStack_60 = fStack_44;
    fStack_5c = fStack_44;
    fVar2 = cabs2(z);
    fVar3 = cabs2(z);
    local_50 = (double)fVar3 * (double)fVar3;
    fVar3 = cabs2(z);
    fVar1 = (float)(SQRT((double)fVar3 * (double)fVar3 + local_50) * (double)(fVar2 + fVar1));
    fStack_74 = cabs2(z);
    local_78 = (float)ca->_M_value / fStack_74;
    fStack_74 = (float)(ca->_M_value >> 0x20) / fStack_74;
    fVar2 = cabs2(z);
    *(float *)cb._M_value = fVar2 / fVar1;
    local_70._M_value = CONCAT44(fStack_44,fStack_48) ^ 0x8000000000000000;
    std::operator*((complex<float> *)&local_78,&local_70);
    *(ulong *)c = CONCAT44(extraout_XMM0_Db / fVar1,extraout_XMM0_Da / fVar1);
    fStack_48 = local_78 * fVar1;
    fStack_44 = fStack_74 * fVar1;
  }
  else {
    *(undefined4 *)cb._M_value = 0;
    c[0] = 1.0;
    c[1] = 0.0;
  }
  ca->_M_value = CONCAT44(fStack_44,fStack_48);
  return;
}

Assistant:

void crotg ( complex <float> *ca, complex <float> cb, float *c,
  complex <float> *s )

//****************************************************************************80
//
//  Purpose:
//
//    CROTG determines a Givens rotation.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    Given values A and B, this routine computes:
//
//    If A = 0:
//
//      R = B
//      C = 0
//      S = (1,0).
//
//    If A /= 0:
//
//      ALPHA = A / abs ( A )
//      NORM  = sqrt ( ( abs ( A ) )**2 + ( abs ( B ) )**2 )
//      R     = ALPHA * NORM
//      C     = abs ( A ) / NORM
//      S     = ALPHA * conj ( B ) / NORM
//
//    In either case, the computed numbers satisfy the equation:
//
//    (         C    S ) * ( A ) = ( R )
//    ( -conj ( S )  C )   ( B ) = ( 0 )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    31 March 2007
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input/output, complex <float> *CA, on input, the value A.  On output,
//    the value R.
//
//    Input, complex <float> CB, the value B.
//
//    Output, float *C, the cosine of the Given rotation.
//
//    Output, complex <float> *S, the sine of the Givens rotation.
//
{
  complex <float> alpha;
  float norm;
  float scale;

  if ( cabs2 ( *ca ) == 0.0 )
  {
    *c = 0.0;
    *s = complex <float> ( 1.0, 0.0 );
    *ca = cb;
  }
  else
  {
    scale = cabs2 ( *ca ) + cabs2 ( cb );
    norm = scale * sqrt ( pow ( cabs2 ( *ca / scale ), 2 )
                        + pow ( cabs2 (  cb / scale ), 2 ) );
    alpha = *ca / cabs2 ( *ca );
    *c = cabs2 ( *ca ) / norm;
    *s = alpha * conj ( cb ) / norm;
    *ca = alpha * norm;
  }

  return;
}